

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

void glcts::prepareTextureCoordinatesForGatherForFace
               (GLfloat *data,GLuint width,GLuint height,GLfloat layer,GLuint face)

{
  GLuint i;
  long lVar1;
  float fVar2;
  GLfloat GVar3;
  GLfloat GVar4;
  GLfloat GVar5;
  float fVar6;
  float fVar7;
  GLfloat GVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  GLfloat GVar12;
  GLfloat GVar13;
  GLfloat GVar14;
  GLfloat GVar15;
  float fVar16;
  
  if (5 < face) goto LAB_00d72592;
  fVar9 = 2.0 / (float)width;
  fVar7 = 2.0 / (float)height;
  GVar4 = -1.0;
  fVar2 = 1.0;
  fVar6 = fVar9 * 0.5 + -1.0 + fVar9;
  GVar3 = (1.0 - fVar9 * 0.5) - fVar9;
  fVar9 = (1.0 - fVar7 * 0.5) - fVar7;
  fVar7 = fVar7 * 0.5 + -1.0 + fVar7;
  fVar10 = 0.0;
  GVar5 = fVar9;
  GVar12 = GVar3;
  GVar15 = fVar7;
  switch(face) {
  case 1:
    fVar2 = -1.0;
  case 0:
    GVar4 = 0.0;
    GVar14 = 0.0;
    fVar11 = 0.0;
    fVar9 = GVar3;
    GVar8 = fVar2;
    GVar12 = fVar2;
    GVar13 = fVar6;
    fVar7 = fVar6;
    fVar16 = GVar3;
    goto LAB_00d724c5;
  case 2:
    fVar11 = 1.0;
    break;
  case 3:
    fVar11 = -1.0;
    break;
  case 4:
    GVar4 = 1.0;
    goto LAB_00d72496;
  case 5:
LAB_00d72496:
    fVar11 = fVar7;
    fVar2 = fVar6;
    GVar5 = GVar4;
    fVar6 = fVar9;
    GVar8 = 0.0;
    fVar10 = fVar9;
    GVar13 = 0.0;
    GVar14 = 0.0;
    GVar15 = GVar4;
    GVar3 = 0.0;
    fVar16 = fVar7;
    goto LAB_00d724c5;
  }
  GVar4 = 0.0;
  fVar2 = fVar6;
  fVar9 = fVar11;
  fVar6 = fVar11;
  GVar8 = 0.0;
  fVar10 = fVar11;
  GVar13 = fVar11;
  GVar14 = fVar11;
  GVar3 = fVar11;
  fVar7 = fVar11;
  fVar16 = fVar11;
LAB_00d724c5:
  *data = fVar2;
  data[1] = fVar6;
  data[2] = GVar5;
  data[3] = layer;
  data[4] = GVar8;
  data[5] = fVar10;
  data[6] = GVar5;
  data[7] = layer;
  data[8] = GVar12;
  data[9] = fVar9;
  data[10] = GVar5;
  data[0xb] = layer;
  data[0xc] = fVar2;
  data[0xd] = GVar13;
  data[0xe] = GVar4;
  data[0xf] = layer;
  data[0x10] = GVar8;
  data[0x11] = GVar14;
  data[0x12] = GVar4;
  data[0x13] = layer;
  data[0x14] = GVar12;
  data[0x15] = GVar3;
  data[0x16] = GVar4;
  data[0x17] = layer;
  data[0x18] = fVar2;
  data[0x19] = fVar7;
  data[0x1a] = GVar15;
  data[0x1b] = layer;
  data[0x1c] = GVar8;
  data[0x1d] = fVar11;
  data[0x1e] = GVar15;
  data[0x1f] = layer;
  data[0x20] = GVar12;
  data[0x21] = fVar16;
  data[0x22] = GVar15;
  data[0x23] = layer;
LAB_00d72592:
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + data[lVar1] * data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    data[lVar1] = data[lVar1] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + data[lVar1 + 4] * data[lVar1 + 4];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    data[lVar1 + 4] = data[lVar1 + 4] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + data[lVar1 + 8] * data[lVar1 + 8];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    data[lVar1 + 8] = data[lVar1 + 8] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + data[lVar1 + 0xc] * data[lVar1 + 0xc];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    data[lVar1 + 0xc] = data[lVar1 + 0xc] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + data[lVar1 + 0x10] * data[lVar1 + 0x10];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    data[lVar1 + 0x10] = data[lVar1 + 0x10] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + data[lVar1 + 0x14] * data[lVar1 + 0x14];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    data[lVar1 + 0x14] = data[lVar1 + 0x14] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + data[lVar1 + 0x18] * data[lVar1 + 0x18];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    data[lVar1 + 0x18] = data[lVar1 + 0x18] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + data[lVar1 + 0x1c] * data[lVar1 + 0x1c];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    data[lVar1 + 0x1c] = data[lVar1 + 0x1c] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + data[lVar1 + 0x20] * data[lVar1 + 0x20];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    data[lVar1 + 0x20] = data[lVar1 + 0x20] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return;
}

Assistant:

void prepareTextureCoordinatesForGatherForFace(glw::GLfloat* data, glw::GLuint width, glw::GLuint height,
											   glw::GLfloat layer, glw::GLuint face)
{
	const glw::GLfloat x_range = (glw::GLfloat)width;
	const glw::GLfloat y_range = (glw::GLfloat)height;

	const glw::GLfloat x_step = 2.0f / x_range;
	const glw::GLfloat y_step = 2.0f / y_range;

	const glw::GLfloat x_mid_step = x_step / 2.0f;
	const glw::GLfloat y_mid_step = y_step / 2.0f;

	const glw::GLfloat left		= -1.0f + x_mid_step + x_step;
	const glw::GLfloat right	= 1.0f - x_mid_step - x_step;
	const glw::GLfloat top		= 1.0f - y_mid_step - y_step;
	const glw::GLfloat bottom   = -1.0f + y_mid_step + y_step;
	const glw::GLfloat middle   = 0.0f;
	const glw::GLfloat negative = -1.0f;
	const glw::GLfloat positive = 1.0f;

	switch (face)
	{
	case 0:
		vectorSet4(data, 0, positive, left, top, layer);
		vectorSet4(data, 1, positive, middle, top, layer);
		vectorSet4(data, 2, positive, right, top, layer);
		vectorSet4(data, 3, positive, left, middle, layer);
		vectorSet4(data, 4, positive, middle, middle, layer);
		vectorSet4(data, 5, positive, right, middle, layer);
		vectorSet4(data, 6, positive, left, bottom, layer);
		vectorSet4(data, 7, positive, middle, bottom, layer);
		vectorSet4(data, 8, positive, right, bottom, layer);
		break;
	case 1:
		vectorSet4(data, 0, negative, left, top, layer);
		vectorSet4(data, 1, negative, middle, top, layer);
		vectorSet4(data, 2, negative, right, top, layer);
		vectorSet4(data, 3, negative, left, middle, layer);
		vectorSet4(data, 4, negative, middle, middle, layer);
		vectorSet4(data, 5, negative, right, middle, layer);
		vectorSet4(data, 6, negative, left, bottom, layer);
		vectorSet4(data, 7, negative, middle, bottom, layer);
		vectorSet4(data, 8, negative, right, bottom, layer);
		break;
	case 2:
		vectorSet4(data, 0, left, positive, top, layer);
		vectorSet4(data, 1, middle, positive, top, layer);
		vectorSet4(data, 2, right, positive, top, layer);
		vectorSet4(data, 3, left, positive, middle, layer);
		vectorSet4(data, 4, middle, positive, middle, layer);
		vectorSet4(data, 5, right, positive, middle, layer);
		vectorSet4(data, 6, left, positive, bottom, layer);
		vectorSet4(data, 7, middle, positive, bottom, layer);
		vectorSet4(data, 8, right, positive, bottom, layer);
		break;
	case 3:
		vectorSet4(data, 0, left, negative, top, layer);
		vectorSet4(data, 1, middle, negative, top, layer);
		vectorSet4(data, 2, right, negative, top, layer);
		vectorSet4(data, 3, left, negative, middle, layer);
		vectorSet4(data, 4, middle, negative, middle, layer);
		vectorSet4(data, 5, right, negative, middle, layer);
		vectorSet4(data, 6, left, negative, bottom, layer);
		vectorSet4(data, 7, middle, negative, bottom, layer);
		vectorSet4(data, 8, right, negative, bottom, layer);
		break;
	case 4:
		vectorSet4(data, 0, left, top, positive, layer);
		vectorSet4(data, 1, middle, top, positive, layer);
		vectorSet4(data, 2, right, top, positive, layer);
		vectorSet4(data, 3, left, middle, positive, layer);
		vectorSet4(data, 4, middle, middle, positive, layer);
		vectorSet4(data, 5, right, middle, positive, layer);
		vectorSet4(data, 6, left, bottom, positive, layer);
		vectorSet4(data, 7, middle, bottom, positive, layer);
		vectorSet4(data, 8, right, bottom, positive, layer);
		break;
	case 5:
		vectorSet4(data, 0, left, top, negative, layer);
		vectorSet4(data, 1, middle, top, negative, layer);
		vectorSet4(data, 2, right, top, negative, layer);
		vectorSet4(data, 3, left, middle, negative, layer);
		vectorSet4(data, 4, middle, middle, negative, layer);
		vectorSet4(data, 5, right, middle, negative, layer);
		vectorSet4(data, 6, left, bottom, negative, layer);
		vectorSet4(data, 7, middle, bottom, negative, layer);
		vectorSet4(data, 8, right, bottom, negative, layer);
		break;
	};

	vectorNormalize<3, 4>(data, 0);
	vectorNormalize<3, 4>(data, 1);
	vectorNormalize<3, 4>(data, 2);
	vectorNormalize<3, 4>(data, 3);
	vectorNormalize<3, 4>(data, 4);
	vectorNormalize<3, 4>(data, 5);
	vectorNormalize<3, 4>(data, 6);
	vectorNormalize<3, 4>(data, 7);
	vectorNormalize<3, 4>(data, 8);
}